

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall
CMU462::Application::dragSelection
          (Application *this,float x,float y,float dx,float dy,Matrix4x4 *modelViewProj)

{
  size_t sVar1;
  HalfedgeElement *pHVar2;
  SceneObject *pSVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Matrix4x4 *modelViewProj_local;
  float dy_local;
  float dx_local;
  float y_local;
  float x_local;
  Application *this_local;
  
  if ((this->scene->selected).object != (SceneObject *)0x0) {
    sVar1 = this->screenW;
    auVar6._8_4_ = (int)(sVar1 >> 0x20);
    auVar6._0_8_ = sVar1;
    auVar6._12_4_ = DAT_002df730._4_4_;
    fVar4 = (float)((double)dx *
                   (2.0 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44((int)DAT_002df730,(int)sVar1) - 4503599627370496.0))));
    sVar1 = this->screenH;
    auVar7._8_4_ = (int)(sVar1 >> 0x20);
    auVar7._0_8_ = sVar1;
    auVar7._12_4_ = DAT_002df730._4_4_;
    fVar5 = (float)((double)dy *
                   (-2.0 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44((int)DAT_002df730,(int)sVar1) - 4503599627370496.0))));
    if ((this->scene->selected).element == (HalfedgeElement *)0x0) {
      pSVar3 = (this->scene->selected).object;
      (*pSVar3->_vptr_SceneObject[6])
                ((double)x,(double)y,(double)fVar4,(double)fVar5,pSVar3,modelViewProj);
    }
    else {
      pHVar2 = (this->scene->selected).element;
      (*pHVar2->_vptr_HalfedgeElement[4])((double)fVar4,(double)fVar5,pHVar2,modelViewProj);
    }
  }
  return;
}

Assistant:

void Application::dragSelection( float x, float y, float dx, float dy, const Matrix4x4& modelViewProj )
{
   if( scene->selected.object == nullptr ) return;

   dx *=  2./screenW;
   dy *= -2./screenH;

   if( scene->selected.element )
   {
      scene->selected.element->translate( dx, dy, modelViewProj );
   }
   else
   {
      scene->selected.object->drag( x, y, dx, dy, modelViewProj );
   }
}